

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

int Gia_ManCountRanks(Gia_Man_t *p)

{
  int iVar1;
  int iObj;
  uint uVar2;
  Vec_Int_t *vRanks;
  Vec_Int_t *vCands;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int iVar3;
  uint Rank;
  
  iVar3 = p->nObjs;
  vRanks = Vec_IntAlloc(iVar3);
  vRanks->nSize = iVar3;
  if (vRanks->pArray != (int *)0x0) {
    memset(vRanks->pArray,0xff,(long)iVar3 << 2);
  }
  iVar3 = p->nObjs;
  vCands = Vec_IntAlloc(iVar3);
  vCands->nSize = iVar3;
  if (vCands->pArray != (int *)0x0) {
    memset(vCands->pArray,0,(long)iVar3 << 2);
  }
  if (p->vCos->nSize <= p->nRegs) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x14c,"int Gia_ManCountRanks(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrentId(p,0);
  p_00 = Vec_IntAlloc(100);
  for (iVar3 = 0; iVar3 < p->vCos->nSize - p->nRegs; iVar3 = iVar3 + 1) {
    pObj = Gia_ManCo(p,iVar3);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    Vec_IntPush(p_00,iVar1);
  }
  Rank = 0;
  iVar3 = 0;
  while (iVar1 = p_00->nSize, iVar3 < iVar1) {
    for (; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      iObj = Vec_IntEntry(p_00,iVar3);
      Gia_ManCountRanks_rec(p,iObj,p_00,vRanks,vCands,Rank);
    }
    Rank = Rank + 1;
    iVar3 = iVar1;
  }
  Vec_IntWriteEntry(vCands,0,0);
  uVar2 = Vec_IntSum(vCands);
  iVar3 = p->vCis->nSize;
  printf("Tents = %6d.   Cands = %6d.  %10.2f %%\n",
         ((double)(int)uVar2 * 100.0) / (double)(iVar3 + p->nObjs + ~(p->vCos->nSize + iVar3)),
         (ulong)Rank,(ulong)uVar2);
  Vec_IntFree(p_00);
  Vec_IntFree(vRanks);
  Vec_IntFree(vCands);
  return Rank;
}

Assistant:

int Gia_ManCountRanks( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vCands = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;  
    int t, i, iObj, nSizeCurr = 0;
    assert( Gia_ManPoNum(p) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    vRoots = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, pObj) );
    for ( t = 0; nSizeCurr < Vec_IntSize(vRoots); t++ )
    {
        int nSizePrev = nSizeCurr;
        nSizeCurr = Vec_IntSize(vRoots);
        Vec_IntForEachEntryStartStop( vRoots, iObj, i, nSizePrev, nSizeCurr )
            Gia_ManCountRanks_rec( p, iObj, vRoots, vRanks, vCands, t );
    }
    Vec_IntWriteEntry( vCands, 0, 0 );
    printf( "Tents = %6d.   Cands = %6d.  %10.2f %%\n", t, Vec_IntSum(vCands), 100.0*Vec_IntSum(vCands)/Gia_ManCandNum(p) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCands );
    return t;
}